

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall spectest::JSONParser::ParseString(JSONParser *this,string *out_string)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  char *format;
  bool bVar5;
  
  out_string->_M_string_length = 0;
  *(out_string->_M_dataplus)._M_p = '\0';
  SkipWhitespace(this);
  iVar1 = ReadChar(this);
  if (iVar1 != 0x22) {
    format = "expected string";
LAB_0011aec3:
    PrintError(this,format);
    return (Result)Error;
  }
  format = "expected escape: \\uxxxx";
  do {
    while (iVar1 = ReadChar(this), iVar1 != 0x5c) {
      if (iVar1 == 0x22) {
        return (Result)Ok;
      }
LAB_0011ae8f:
      std::__cxx11::string::push_back((char)out_string);
    }
    iVar1 = ReadChar(this);
    if (iVar1 != 0x75) goto LAB_0011aec3;
    uVar4 = 0;
    iVar1 = 4;
    while (bVar5 = iVar1 != 0, iVar1 = iVar1 + -1, bVar5) {
      iVar2 = ReadChar(this);
      uVar3 = iVar2 - 0x30;
      if (9 < uVar3) {
        if (iVar2 - 0x61U < 6) {
          uVar3 = iVar2 - 0x57;
        }
        else {
          if (5 < iVar2 - 0x41U) {
            format = "expected hex char";
            goto LAB_0011aec3;
          }
          uVar3 = iVar2 - 0x37;
        }
      }
      uVar4 = (ulong)((int)uVar4 * 0x10 + uVar3);
    }
    if ((ushort)uVar4 < 0x100) goto LAB_0011ae8f;
    PrintError(this,"only escape codes < 256 allowed, got %u\n",uVar4 & 0xffff);
  } while( true );
}

Assistant:

wabt::Result JSONParser::ParseString(std::string* out_string) {
  out_string->clear();

  SkipWhitespace();
  if (ReadChar() != '"') {
    PrintError("expected string");
    return wabt::Result::Error;
  }

  while (1) {
    int c = ReadChar();
    if (c == '"') {
      break;
    } else if (c == '\\') {
      /* The only escape supported is \uxxxx. */
      c = ReadChar();
      if (c != 'u') {
        PrintError("expected escape: \\uxxxx");
        return wabt::Result::Error;
      }
      uint16_t code = 0;
      for (int i = 0; i < 4; ++i) {
        c = ReadChar();
        int cval;
        if (c >= '0' && c <= '9') {
          cval = c - '0';
        } else if (c >= 'a' && c <= 'f') {
          cval = c - 'a' + 10;
        } else if (c >= 'A' && c <= 'F') {
          cval = c - 'A' + 10;
        } else {
          PrintError("expected hex char");
          return wabt::Result::Error;
        }
        code = (code << 4) + cval;
      }

      if (code < 256) {
        *out_string += code;
      } else {
        PrintError("only escape codes < 256 allowed, got %u\n", code);
      }
    } else {
      *out_string += c;
    }
  }
  return wabt::Result::Ok;
}